

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O0

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verify<char[70],int>(char (*contents) [70],Options *options)

{
  uchar *in_RCX;
  size_t siglen;
  uchar *in_RSI;
  size_t in_R8;
  char (*in_stack_00000158) [70];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  EVP_PKEY_CTX local_30 [32];
  uchar *local_10;
  
  local_10 = in_RSI;
  StringMaker::toString<char[70]>(in_stack_00000158);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
            (local_30,local_10,siglen,in_RCX,in_R8);
  ::std::__cxx11::string::~string(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

static void verify(const T& contents, const Options& options = Options())
        {
            verify(TCompileTimeOptions::ToStringConverter::toString(contents), options);
        }